

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

Data * __thiscall
QUtcTimeZonePrivate::data
          (Data *__return_storage_ptr__,QUtcTimeZonePrivate *this,qint64 forMSecsSinceEpoch)

{
  int iVar1;
  
  *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
  (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->abbreviation).d.size = 0;
  __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
  __return_storage_ptr__->offsetFromUtc = -0x80000000;
  __return_storage_ptr__->standardTimeOffset = -0x80000000;
  __return_storage_ptr__->daylightTimeOffset = -0x80000000;
  QString::operator=(&__return_storage_ptr__->abbreviation,&this->m_abbreviation);
  __return_storage_ptr__->atMSecsSinceEpoch = forMSecsSinceEpoch;
  iVar1 = this->m_offsetFromUtc;
  __return_storage_ptr__->offsetFromUtc = iVar1;
  __return_storage_ptr__->standardTimeOffset = iVar1;
  __return_storage_ptr__->daylightTimeOffset = 0;
  return __return_storage_ptr__;
}

Assistant:

QTimeZonePrivate::Data QUtcTimeZonePrivate::data(qint64 forMSecsSinceEpoch) const
{
    Data d;
    d.abbreviation = m_abbreviation;
    d.atMSecsSinceEpoch = forMSecsSinceEpoch;
    d.standardTimeOffset = d.offsetFromUtc = m_offsetFromUtc;
    d.daylightTimeOffset = 0;
    return d;
}